

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::LogQueryPathSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  ClientData *pCVar1;
  pointer pBVar2;
  LogicalType LStack_48;
  string local_30;
  
  pCVar1 = ClientData::Get(context);
  if ((pCVar1->log_query_writer).
      super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
      .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl ==
      (BufferedFileWriter *)0x0) {
    LogicalType::LogicalType(&LStack_48,SQLNULL);
    Value::Value(__return_storage_ptr__,&LStack_48);
    LogicalType::~LogicalType(&LStack_48);
  }
  else {
    pBVar2 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator->(&pCVar1->log_query_writer);
    ::std::__cxx11::string::string((string *)&local_30,(string *)&pBVar2->path);
    Value::Value(__return_storage_ptr__,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Value LogQueryPathSetting::GetSetting(const ClientContext &context) {
	auto &client_data = ClientData::Get(context);
	return client_data.log_query_writer ? Value(client_data.log_query_writer->path) : Value();
}